

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

int __thiscall httplib::ThreadPool::shutdown(ThreadPool *this,int __fd,int __how)

{
  pointer ptVar1;
  int iVar2;
  thread *t;
  pointer ptVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->mutex_);
  this->shutdown_ = true;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  iVar2 = std::condition_variable::notify_all();
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1) {
    iVar2 = std::thread::join();
  }
  return iVar2;
}

Assistant:

void shutdown() override {
            // Stop all worker threads...
            {
                std::unique_lock<std::mutex> lock(mutex_);
                shutdown_ = true;
            }

            cond_.notify_all();

            // Join...
            for (auto& t : threads_) {
                t.join();
            }
        }